

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::TraceConfig_TriggerConfig::operator==
          (TraceConfig_TriggerConfig *this,TraceConfig_TriggerConfig *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  if (((_Var1) && (this->trigger_mode_ == other->trigger_mode_)) &&
     (bVar2 = ::std::operator==(&this->triggers_,&other->triggers_), bVar2)) {
    return this->trigger_timeout_ms_ == other->trigger_timeout_ms_;
  }
  return false;
}

Assistant:

bool TraceConfig_TriggerConfig::operator==(const TraceConfig_TriggerConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && trigger_mode_ == other.trigger_mode_
   && triggers_ == other.triggers_
   && trigger_timeout_ms_ == other.trigger_timeout_ms_;
}